

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O3

int secp256k1_musig_nonce_agg
              (secp256k1_context *ctx,secp256k1_musig_aggnonce *aggnonce,
              secp256k1_musig_pubnonce **pubnonces,size_t n_pubnonces)

{
  int iVar1;
  secp256k1_ge aggnonce_pts [2];
  secp256k1_gej aggnonce_ptsj [2];
  secp256k1_ge sStack_218;
  secp256k1_ge local_1b0;
  secp256k1_gej local_148 [2];
  
  if (ctx == (secp256k1_context *)0x0) {
    secp256k1_musig_nonce_agg_cold_4();
  }
  else if (aggnonce != (secp256k1_musig_aggnonce *)0x0) {
    if (pubnonces == (secp256k1_musig_pubnonce **)0x0) {
      secp256k1_musig_nonce_agg_cold_2();
      return 0;
    }
    if (n_pubnonces != 0) {
      iVar1 = secp256k1_musig_sum_pubnonces(ctx,local_148,pubnonces,n_pubnonces);
      if (iVar1 == 0) {
        return 0;
      }
      secp256k1_ge_set_all_gej_var(&sStack_218,local_148,2);
      aggnonce->data[0] = 0xa8;
      aggnonce->data[1] = 0xb7;
      aggnonce->data[2] = 0xe4;
      aggnonce->data[3] = 'g';
      secp256k1_ge_to_bytes_ext(aggnonce->data + 4,&sStack_218);
      secp256k1_ge_to_bytes_ext(aggnonce->data + 0x44,&local_1b0);
      return 1;
    }
    secp256k1_musig_nonce_agg_cold_1();
    return 0;
  }
  secp256k1_musig_nonce_agg_cold_3();
  return 0;
}

Assistant:

int secp256k1_musig_nonce_agg(const secp256k1_context* ctx, secp256k1_musig_aggnonce  *aggnonce, const secp256k1_musig_pubnonce * const* pubnonces, size_t n_pubnonces) {
    secp256k1_gej aggnonce_ptsj[2];
    secp256k1_ge aggnonce_pts[2];
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(aggnonce != NULL);
    ARG_CHECK(pubnonces != NULL);
    ARG_CHECK(n_pubnonces > 0);

    if (!secp256k1_musig_sum_pubnonces(ctx, aggnonce_ptsj, pubnonces, n_pubnonces)) {
        return 0;
    }
    secp256k1_ge_set_all_gej_var(aggnonce_pts, aggnonce_ptsj, 2);
    secp256k1_musig_aggnonce_save(aggnonce, aggnonce_pts);
    return 1;
}